

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult __thiscall
testing::internal::CmpHelperSTRNE
          (internal *this,char *s1_expression,char *s2_expression,wchar_t *s1,wchar_t *s2)

{
  bool bVar1;
  AssertionResult *pAVar2;
  wchar_t **value;
  wchar_t **value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult AVar4;
  string local_90;
  string local_70;
  AssertionResult local_40;
  wchar_t *local_30;
  wchar_t *s2_local;
  wchar_t *s1_local;
  char *s2_expression_local;
  char *s1_expression_local;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  
  local_30 = s2;
  s2_local = s1;
  s1_local = (wchar_t *)s2_expression;
  s2_expression_local = s1_expression;
  s1_expression_local = (char *)this;
  bVar1 = String::WideCStringEquals(s1,s2);
  if (bVar1) {
    AssertionFailure();
    pAVar2 = AssertionResult::operator<<(&local_40,(char (*) [12])"Expected: (");
    pAVar2 = AssertionResult::operator<<(pAVar2,&s2_expression_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [7])") != (");
    pAVar2 = AssertionResult::operator<<(pAVar2,(char **)&s1_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [12])"), actual: ");
    PrintToString<wchar_t_const*>(&local_70,(testing *)&s2_local,value);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_70);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [5])" vs ");
    PrintToString<wchar_t_const*>(&local_90,(testing *)&local_30,value_00);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_90);
    AssertionResult::AssertionResult((AssertionResult *)this,pAVar2);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    AssertionResult::~AssertionResult((AssertionResult *)0x2550cd);
    sVar3.ptr_ = extraout_RDX;
  }
  else {
    AVar4 = AssertionSuccess();
    sVar3 = AVar4.message_.ptr_;
  }
  AVar4.message_.ptr_ = sVar3.ptr_;
  AVar4._0_8_ = this;
  return AVar4;
}

Assistant:

AssertionResult CmpHelperSTRNE(const char* s1_expression,
                               const char* s2_expression,
                               const wchar_t* s1,
                               const wchar_t* s2) {
  if (!String::WideCStringEquals(s1, s2)) {
    return AssertionSuccess();
  }

  return AssertionFailure() << "Expected: (" << s1_expression << ") != ("
                            << s2_expression << "), actual: "
                            << PrintToString(s1)
                            << " vs " << PrintToString(s2);
}